

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O1

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&)>::
cmCommandLineArgument<(anonymous_namespace)::do_build(int,char_const*const*)::__4&>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&)> *this,string *n,Values t,
          anon_class_24_3_a7ad77a2 *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined4 in_register_00000014;
  undefined8 *puVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  pointer local_28;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000014,t);
  local_28 = (n->_M_dataplus)._M_p;
  local_30 = n->_M_string_length;
  local_40._M_len = 0x17;
  local_40._M_str = " is invalid syntax for ";
  views._M_len = 2;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_((string *)this,views);
  local_28 = (n->_M_dataplus)._M_p;
  local_30 = n->_M_string_length;
  local_40._M_len = 0x18;
  local_40._M_str = "Invalid value used with ";
  views_00._M_len = 2;
  views_00._M_array = &local_40;
  cmCatViews_abi_cxx11_((string *)(this + 0x20),views_00);
  *(cmCommandLineArgument<bool(std::__cxx11::string_const&)> **)(this + 0x40) = this + 0x50;
  pcVar2 = (n->_M_dataplus)._M_p;
  paVar1 = &n->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&n->field_2 + 8);
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x58) = uVar3;
  }
  else {
    *(pointer *)(this + 0x40) = pcVar2;
    *(size_type *)(this + 0x50) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x48) = n->_M_string_length;
  (n->_M_dataplus)._M_p = (pointer)paVar1;
  n->_M_string_length = 0;
  (n->field_2)._M_local_buf[0] = '\0';
  *(undefined4 *)(this + 0x60) = 4;
  *(undefined8 *)(this + 100) = 0;
  *(undefined8 *)(this + 0x6c) = 0;
  *(undefined8 *)(this + 0x74) = 0;
  *(undefined8 *)(this + 0x7c) = 0;
  *(undefined4 *)(this + 0x84) = 0;
  puVar4 = (undefined8 *)operator_new(0x18);
  puVar4[2] = puVar5[2];
  uVar3 = puVar5[1];
  *puVar4 = *puVar5;
  puVar4[1] = uVar3;
  *(undefined8 **)(this + 0x68) = puVar4;
  *(code **)(this + 0x80) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmakemain.cxx:455:23)>
       ::_M_invoke;
  *(code **)(this + 0x78) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmakemain.cxx:455:23)>
       ::_M_manager;
  return;
}

Assistant:

cmCommandLineArgument(std::string n, Values t, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(cmStrCat("Invalid value used with ", n))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(RequiresSeparator::Yes)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }